

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_miniscript_wrapper_c(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint32_t x_prop;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  if ((node->type_properties & 4) == 0) {
    node_local._4_4_ = -2;
  }
  else {
    node->type_properties = node->type_properties & 0xfffffffb;
    node->type_properties = node->type_properties | 1;
    node->type_properties = node->type_properties & 0x16e0f;
    node->type_properties = node->type_properties | 0x9000;
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_miniscript_wrapper_c(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop = node->type_properties;
    (void)parent;
    if (!(x_prop & MINISCRIPT_TYPE_K))
        return WALLY_EINVAL;

    node->type_properties &= ~MINISCRIPT_TYPE_K;
    node->type_properties |= MINISCRIPT_TYPE_B;
    node->type_properties &= MINISCRIPT_TYPE_MASK | MINISCRIPT_PROPERTY_O |
                             MINISCRIPT_PROPERTY_N | MINISCRIPT_PROPERTY_D |
                             MINISCRIPT_PROPERTY_F | MINISCRIPT_PROPERTY_E |
                             MINISCRIPT_PROPERTY_M;
    node->type_properties |= MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_S;

    return WALLY_OK;
}